

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CreateRawTransactionRefine_Test::TestBody
          (cfdcapi_elements_transaction_CreateRawTransactionRefine_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  long *expected_predicate_value;
  undefined1 uVar3;
  char *in_stack_00000100;
  char *in_stack_00000108;
  char *in_stack_00000110;
  int64_t in_stack_00000118;
  void *in_stack_00000120;
  void *in_stack_00000128;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  char *str_buffer;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  char *in_stack_00000478;
  char *in_stack_00000480;
  char *in_stack_00000488;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  uint32_t index;
  int64_t satoshi;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff888;
  AssertionResult *in_stack_fffffffffffff890;
  CfdErrorCode *in_stack_fffffffffffff898;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  void **in_stack_fffffffffffff8a8;
  void *in_stack_fffffffffffff8c8;
  char **in_stack_fffffffffffff920;
  AssertionResult *in_stack_fffffffffffff928;
  uint32_t in_stack_fffffffffffffa50;
  uint32_t in_stack_fffffffffffffa54;
  char *in_stack_fffffffffffffa58;
  void *in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined4 local_4cc;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  undefined4 local_484;
  AssertionResult local_480;
  char *local_470;
  AssertHelper local_468;
  Message local_460;
  undefined4 local_454;
  AssertionResult local_450;
  AssertHelper local_440;
  Message local_438;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  uint32_t in_stack_fffffffffffffbdc;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbe0;
  AssertHelper in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_38c;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  undefined4 local_364;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  undefined4 local_314;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  undefined4 local_2ec;
  void **in_stack_fffffffffffffd18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  uint32_t in_stack_fffffffffffffd2c;
  uint32_t in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined4 local_1b4;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f1;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  long local_b8;
  undefined4 local_ac;
  undefined8 local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  AssertHelper in_stack_ffffffffffffffb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff8a8);
  uVar5 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
             in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3356ca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x33572d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x335782);
  uVar3 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,(type *)0x3357b6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&stack0xffffffffffffffa0,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xe1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&stack0xffffffffffffff90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3358b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33592d);
  local_a0 = (char *)0x0;
  local_ac = 0;
  local_b8 = 0;
  expected_predicate_value = &local_b8;
  local_14 = CfdInitializeTransaction
                       ((void *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                        in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,
                        in_stack_fffffffffffffd2c,(char *)in_stack_fffffffffffffd20.ptr_,
                        in_stack_fffffffffffffd18);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
             in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x335a28);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x335a8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x335ae0);
  local_f1 = local_b8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,(type *)0x335b14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_f0,(AssertionResult *)"(NULL == create_handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message((Message *)0x335c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x335c8b);
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         ((void *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                          in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                          in_stack_fffffffffffffa54,in_stack_fffffffffffffa50);
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x335d71);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xef,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x335dd4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x335e29);
  }
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         ((void *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                          in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                          in_stack_fffffffffffffa54,in_stack_fffffffffffffa50);
    local_164 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x335f14);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xf6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message((Message *)0x335f77);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x335fcc);
  }
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         ((void *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                          in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                          in_stack_fffffffffffffa54,in_stack_fffffffffffffa50);
    local_18c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3360b7);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xfd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message((Message *)0x33611a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33616f);
  }
  if (local_14 == 0) {
    local_a8 = 100000000;
    local_14 = CfdAddTransactionOutput
                         (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
                          in_stack_00000108,in_stack_00000100);
    local_1b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336271);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x106,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x3362d4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336329);
  }
  if (local_14 == 0) {
    local_a8 = 1900000000;
    local_14 = CfdAddTransactionOutput
                         (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
                          in_stack_00000108,in_stack_00000100);
    local_1dc = 0;
    pAVar4 = &local_1d8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33642b);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x10f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x33648e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3364e3);
  }
  if (local_14 == 0) {
    local_a8 = 500000;
    in_stack_fffffffffffff888 = (bool *)0x8971a8;
    local_14 = CfdAddConfidentialTxOutput
                         (in_stack_ffffffffffffffb8.ptr_,in_stack_ffffffffffffffb0.data_,
                          (int64_t)in_stack_ffffffffffffffa8.ptr_,in_stack_ffffffffffffffa0,
                          (char *)CONCAT17(uVar3,in_stack_ffffffffffffff98),
                          (char *)in_stack_ffffffffffffff90.ptr_,
                          (char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0));
    local_204 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3365eb);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x117,pcVar2);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x33664e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3366a3);
  }
  if (local_14 == 0) {
    local_a8 = 500000;
    local_14 = CfdAddTransactionOutput
                         (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
                          in_stack_00000108,in_stack_00000100);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33679f);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x120,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x336802);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336857);
  }
  if (local_14 == 0) {
    local_14 = CfdFinalizeTransaction
                         (in_stack_fffffffffffff890,in_stack_fffffffffffff888,(char **)0x336896);
    local_254 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336938);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x125,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x33699b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3369f0);
  }
  CfdFreeTransactionHandle(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_278,
               "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff040151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000713fb300001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a12000016a01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000\""
               ,"tx_string",
               "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff040151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000713fb300001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a12000016a01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336ab6);
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,299,pcVar2);
      testing::internal::AssertHelper::operator=(&local_288,&local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      testing::Message::~Message((Message *)0x336b19);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336b6e);
  }
  if (local_14 == 0) {
    local_ac = 0;
    local_14 = CfdGetTxInIndex((void *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)
                               ,in_stack_fffffffffffffbf4,(char *)in_stack_fffffffffffffbe8.data_,
                               (char *)in_stack_fffffffffffffbe0.ptr_,in_stack_fffffffffffffbdc,
                               (uint32_t *)
                               CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
    local_29c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336c6c);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x133,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x336ccf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336d24);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd30);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336dd1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x134,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd28,(Message *)&stack0xfffffffffffffd30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd28);
      testing::Message::~Message((Message *)0x336e34);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336e89);
  }
  if (local_14 == 0) {
    local_14 = CfdGetTxOutIndex(gtest_ar_13.message_.ptr_,gtest_ar_13._4_4_,in_stack_00000488,
                                in_stack_00000480,in_stack_00000478,
                                (uint32_t *)gtest_ar_14.message_.ptr_);
    local_2ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd18);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336f7b);
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x13b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      testing::Message::~Message((Message *)0x336fde);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337033);
    local_314 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890,in_stack_fffffffffffff888
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
    if (!bVar1) {
      testing::Message::Message(&local_320);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3370e5);
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x13c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      testing::Message::~Message((Message *)0x337148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33719d);
  }
  if (local_14 == 0) {
    local_14 = CfdGetTxOutIndex(gtest_ar_13.message_.ptr_,gtest_ar_13._4_4_,in_stack_00000488,
                                in_stack_00000480,in_stack_00000478,
                                (uint32_t *)gtest_ar_14.message_.ptr_);
    local_33c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x337291);
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x142,pcVar2);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      testing::Message::~Message((Message *)0x3372f4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337349);
    local_364 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890,in_stack_fffffffffffff888
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message(&local_370);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3373fb);
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x143,pcVar2);
      testing::internal::AssertHelper::operator=(&local_378,&local_370);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      testing::Message::~Message((Message *)0x33745e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3374b3);
  }
  if (local_14 == 0) {
    local_14 = CfdGetTxOutIndex(gtest_ar_13.message_.ptr_,gtest_ar_13._4_4_,in_stack_00000488,
                                in_stack_00000480,in_stack_00000478,
                                (uint32_t *)gtest_ar_14.message_.ptr_);
    local_38c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
    if (!bVar1) {
      testing::Message::Message(&local_398);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3375a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x14a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
      testing::internal::AssertHelper::~AssertHelper(&local_3a0);
      testing::Message::~Message((Message *)0x337608);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33765d);
    local_3b4 = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33770a);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x14b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      testing::Message::~Message((Message *)0x33776d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3377c2);
  }
  if (local_14 == 0) {
    local_14 = CfdGetTxOutIndex(gtest_ar_13.message_.ptr_,gtest_ar_13._4_4_,in_stack_00000488,
                                in_stack_00000480,in_stack_00000478,
                                (uint32_t *)gtest_ar_14.message_.ptr_);
    local_3dc = 0;
    in_stack_fffffffffffff928 = &local_3d8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff928);
    if (!bVar1) {
      testing::Message::Message(&local_3e8);
      in_stack_fffffffffffff920 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3378b6);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x151,(char *)in_stack_fffffffffffff920);
      testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper(&local_3f0);
      testing::Message::~Message((Message *)0x337919);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33796e);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffbf0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x337a1b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffbe8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x152,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffbe8,(Message *)&stack0xfffffffffffffbf0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbe8);
      testing::Message::~Message((Message *)0x337a7e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337ad3);
  }
  if (local_14 == 0) {
    local_14 = CfdGetTxOutIndex(gtest_ar_13.message_.ptr_,gtest_ar_13._4_4_,in_stack_00000488,
                                in_stack_00000480,in_stack_00000478,
                                (uint32_t *)gtest_ar_14.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffbd8);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x337bb5);
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x158,pcVar2);
      testing::internal::AssertHelper::operator=(&local_440,&local_438);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      testing::Message::~Message((Message *)0x337c12);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337c67);
    local_454 = 3;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(uint *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
    if (!bVar1) {
      testing::Message::Message(&local_460);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x337d08);
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x159,pcVar2);
      testing::internal::AssertHelper::operator=(&local_468,&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      testing::Message::~Message((Message *)0x337d65);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337dba);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff8c8);
  if (local_14 != 0) {
    local_470 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    local_484 = 0;
    pAVar4 = &local_480;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff8a8,
               (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898,(int *)in_stack_fffffffffffff890);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_490);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x337ea7);
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x160,pcVar2);
      testing::internal::AssertHelper::operator=(&local_498,&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      testing::Message::~Message((Message *)0x337f04);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337f59);
    testing::internal::CmpHelperSTREQ((internal *)&local_4a8,"\"\"","str_buffer","",local_470);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar1) {
      testing::Message::Message(&local_4b0);
      in_stack_fffffffffffff8a8 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x337fee);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x161,(char *)in_stack_fffffffffffff8a8);
      testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      testing::Message::~Message((Message *)0x33804b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3380a0);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff898);
    local_470 = (char *)0x0;
  }
  if (local_a0 != (char *)0x0) {
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff898);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff898);
  local_4cc = 0;
  pAVar4 = &local_4c8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffff890);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x338188);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    testing::Message::~Message((Message *)0x3381e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33823a);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CreateRawTransactionRefine) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  int64_t satoshi;
  uint32_t index = 0;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(handle, kCfdNetworkLiquidv1, 2, 0, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
      handle, create_handle, "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd", 0,
      4294967295U);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
      handle, create_handle, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      4294967295U);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
      handle, create_handle, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 2,
      4294967295U);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 100000000;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", "",
      "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 1900000000;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", "",
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 500000;
    ret = CfdAddConfidentialTxOutput(
      handle, create_handle, satoshi, "", "6a",
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3", "");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 500000;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      nullptr, nullptr,
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeTransaction(handle, create_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  CfdFreeTransactionHandle(handle, create_handle);

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff040151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000713fb300001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a12000016a01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000", tx_string);
  }

  if (ret == kCfdSuccess) {
    index = 0;
    ret = CfdGetTxInIndex(
      handle, kCfdNetworkLiquidv1, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetTxOutIndex(
      handle, kCfdNetworkLiquidv1, tx_string, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetTxOutIndex(
      handle, kCfdNetworkLiquidv1, tx_string, "", "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetTxOutIndex(
      handle, kCfdNetworkLiquidv1, tx_string, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetTxOutIndex(
      handle, kCfdNetworkLiquidv1, tx_string, "", "76a914fdd725970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetTxOutIndex(
      handle, kCfdNetworkLiquidv1, tx_string, NULL, NULL, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(3, index);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (tx_string != nullptr) {
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}